

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::TimeZoneFormat::getTimeZoneID
          (TimeZoneFormat *this,MatchInfoCollection *matches,int32_t idx,UnicodeString *tzID)

{
  UBool UVar1;
  undefined1 local_a8 [8];
  UnicodeString mzID;
  UChar mzIDBuf [32];
  UnicodeString *tzID_local;
  int32_t idx_local;
  MatchInfoCollection *matches_local;
  TimeZoneFormat *this_local;
  
  UVar1 = TimeZoneNames::MatchInfoCollection::getTimeZoneIDAt(matches,idx,tzID);
  if (UVar1 == '\0') {
    UnicodeString::UnicodeString
              ((UnicodeString *)local_a8,mzID.fUnion.fStackFields.fBuffer + 0x17,0,0x20);
    UVar1 = TimeZoneNames::MatchInfoCollection::getMetaZoneIDAt
                      (matches,idx,(UnicodeString *)local_a8);
    if (UVar1 != '\0') {
      (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[8])
                (this->fTimeZoneNames,local_a8,this->fTargetRegion,tzID);
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_a8);
  }
  return tzID;
}

Assistant:

UnicodeString&
TimeZoneFormat::getTimeZoneID(const TimeZoneNames::MatchInfoCollection* matches, int32_t idx, UnicodeString& tzID) const {
    if (!matches->getTimeZoneIDAt(idx, tzID)) {
        UChar mzIDBuf[32];
        UnicodeString mzID(mzIDBuf, 0, UPRV_LENGTHOF(mzIDBuf));
        if (matches->getMetaZoneIDAt(idx, mzID)) {
            fTimeZoneNames->getReferenceZoneID(mzID, fTargetRegion, tzID);
        }
    }
    return tzID;
}